

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3gau_full_io.c
# Opt level: O1

int s3gaucnt_read_full(char *fn,vector_t ****out_wt_mean,vector_t *****out_wt_var,
                      int32 *out_pass2var,float32 ****out_dnom,uint32 *out_n_cb,uint32 *out_n_feat,
                      uint32 *out_n_density,uint32 **out_veclen)

{
  uint uVar1;
  int iVar2;
  int32 iVar3;
  FILE *fp;
  char *pcVar4;
  vector_t ***ppppfVar5;
  vector_t ****pppppfVar6;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  char *pcVar13;
  char *pcVar14;
  uint32 swap;
  uint32 rd_chksum;
  uint32 n_feat;
  uint32 n_density;
  uint32 n_cb;
  uint32 *veclen;
  int32 local_a0;
  uint32 n;
  uint32 has_vars;
  uint32 has_means;
  ulong local_90;
  float32 *buf;
  uint32 d3;
  uint32 d2;
  uint32 d1;
  uint32 pass2var;
  uint32 sv_chksum;
  char *local_68;
  float32 ****local_60;
  uint32 *local_58;
  vector_t *****local_50;
  uint32 *local_48;
  float32 ***dnom;
  uint32 ignore;
  
  rd_chksum = 0;
  local_50 = out_wt_var;
  local_48 = (uint32 *)out_pass2var;
  fp = s3open(fn,"rb",&swap);
  iVar7 = -1;
  if (fp == (FILE *)0x0) {
    return -1;
  }
  local_60 = out_dnom;
  local_58 = out_n_cb;
  pcVar4 = s3get_gvn_fattr("version");
  if (pcVar4 == (char *)0x0) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3gau_full_io.c"
            ,0x12f,"No version attribute for %s\n",fn);
  }
  else {
    iVar2 = strcmp(pcVar4,"1.0");
    if (iVar2 == 0) {
      pcVar4 = s3get_gvn_fattr("chksum0");
      iVar3 = bio_fread(&has_means,4,1,fp,swap,&rd_chksum);
      if ((((iVar3 == 1) && (iVar3 = bio_fread(&has_vars,4,1,fp,swap,&rd_chksum), iVar3 == 1)) &&
          (iVar3 = bio_fread(&pass2var,4,1,fp,swap,&rd_chksum), iVar3 == 1)) &&
         (((iVar3 = bio_fread(&n_cb,4,1,fp,swap,&rd_chksum), iVar3 == 1 &&
           (iVar3 = bio_fread(&n_density,4,1,fp,swap,&rd_chksum), iVar3 == 1)) &&
          (iVar3 = bio_fread_1d(&veclen,4,&n_feat,fp,swap,&rd_chksum), -1 < iVar3)))) {
        if (has_means == 0) {
          ppppfVar5 = (vector_t ***)0x0;
        }
        else {
          iVar3 = bio_fread_1d(&buf,4,&n,fp,swap,&rd_chksum);
          if (iVar3 < 0) {
            return -1;
          }
          ppppfVar5 = (vector_t ***)
                      __ckd_calloc_3d__((ulong)n_cb,(ulong)n_feat,(ulong)n_density,8,
                                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3gau_full_io.c"
                                        ,0x152);
          if ((ulong)n_cb != 0) {
            uVar8 = 0;
            uVar9 = 0;
            do {
              if ((ulong)n_feat != 0) {
                uVar10 = 0;
                do {
                  if ((ulong)n_density != 0) {
                    uVar11 = 0;
                    do {
                      ppppfVar5[uVar8][uVar10][uVar11] = (vector_t)(buf + uVar9);
                      uVar9 = uVar9 + veclen[uVar10];
                      uVar11 = uVar11 + 1;
                    } while (n_density != uVar11);
                  }
                  uVar10 = uVar10 + 1;
                } while (uVar10 != n_feat);
              }
              uVar8 = uVar8 + 1;
            } while (uVar8 != n_cb);
          }
        }
        pppppfVar6 = (vector_t ****)0x0;
        iVar2 = 0;
        local_68 = pcVar4;
        if (has_vars != 0) {
          if ((ulong)n_feat == 0) {
            local_90 = 0;
          }
          else {
            uVar8 = 0;
            uVar9 = 0;
            iVar2 = 0;
            do {
              uVar1 = veclen[uVar8];
              iVar2 = iVar2 + uVar1;
              if (uVar9 < uVar1) {
                uVar9 = uVar1;
              }
              uVar8 = uVar8 + 1;
            } while (n_feat != uVar8);
            local_90 = (ulong)uVar9;
          }
          iVar3 = bio_fread_1d(&buf,4,&n,fp,swap,&rd_chksum);
          if (iVar3 < 0) {
            pppppfVar6 = (vector_t ****)0x0;
          }
          else {
            local_a0 = iVar3;
            if (n != n_density * n_cb * iVar2 * iVar2) {
              __assert_fail("n == n_cb * n_density * blk * blk",
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3gau_full_io.c"
                            ,0x16a,
                            "int s3gaucnt_read_full(const char *, vector_t ****, vector_t *****, int32 *, float32 ****, uint32 *, uint32 *, uint32 *, uint32 **)"
                           );
            }
            pppppfVar6 = (vector_t ****)
                         __ckd_calloc_4d__((ulong)n_cb,(ulong)n_feat,(ulong)n_density,local_90,8,
                                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3gau_full_io.c"
                                           ,0x16d);
            local_90 = (ulong)n_cb;
            iVar3 = local_a0;
            if (local_90 != 0) {
              uVar8 = 0;
              uVar9 = 0;
              do {
                if ((ulong)n_feat != 0) {
                  uVar10 = 0;
                  do {
                    if ((ulong)n_density != 0) {
                      uVar11 = 0;
                      do {
                        if (veclen[uVar10] != 0) {
                          uVar12 = 0;
                          do {
                            pppppfVar6[uVar8][uVar10][uVar11][uVar12] = (vector_t)(buf + uVar9);
                            uVar9 = uVar9 + veclen[uVar10];
                            uVar12 = uVar12 + 1;
                          } while (uVar12 < veclen[uVar10]);
                        }
                        uVar11 = uVar11 + 1;
                      } while (uVar11 != n_density);
                    }
                    uVar10 = uVar10 + 1;
                  } while (uVar10 != n_feat);
                }
                uVar8 = uVar8 + 1;
              } while (uVar8 != local_90);
            }
          }
          if (iVar3 < 0) {
            return -1;
          }
        }
        iVar3 = bio_fread_3d(&dnom,4,&d1,&d2,&d3,fp,swap,&rd_chksum);
        if (-1 < iVar3) {
          if (d1 != n_cb) {
            __assert_fail("d1 == n_cb",
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3gau_full_io.c"
                          ,0x180,
                          "int s3gaucnt_read_full(const char *, vector_t ****, vector_t *****, int32 *, float32 ****, uint32 *, uint32 *, uint32 *, uint32 **)"
                         );
          }
          if (d2 != n_feat) {
            __assert_fail("d2 == n_feat",
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3gau_full_io.c"
                          ,0x181,
                          "int s3gaucnt_read_full(const char *, vector_t ****, vector_t *****, int32 *, float32 ****, uint32 *, uint32 *, uint32 *, uint32 **)"
                         );
          }
          if (d3 != n_density) {
            __assert_fail("d3 == n_density",
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3gau_full_io.c"
                          ,0x182,
                          "int s3gaucnt_read_full(const char *, vector_t ****, vector_t *****, int32 *, float32 ****, uint32 *, uint32 *, uint32 *, uint32 **)"
                         );
          }
          if (local_68 != (char *)0x0) {
            iVar3 = bio_fread(&sv_chksum,4,1,fp,swap,&ignore);
            if (iVar3 != 1) {
              s3close(fp);
              return -1;
            }
            if (sv_chksum != rd_chksum) {
              err_msg(ERR_FATAL,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3gau_full_io.c"
                      ,0x18e,"Checksum error; read corrupt data.\n");
              goto LAB_00104362;
            }
          }
          s3close(fp);
          *out_wt_mean = ppppfVar5;
          *local_50 = pppppfVar6;
          *local_48 = pass2var;
          *local_60 = dnom;
          *local_58 = n_cb;
          *out_n_feat = n_feat;
          *out_n_density = n_density;
          *out_veclen = veclen;
          pcVar4 = " with means";
          if (has_means == 0) {
            pcVar4 = "";
          }
          pcVar14 = " (2pass)";
          if (pass2var == 0) {
            pcVar14 = "";
          }
          pcVar13 = " with vars";
          if (has_vars == 0) {
            pcVar13 = "";
            pcVar14 = "";
          }
          iVar7 = 0;
          err_msg(ERR_INFO,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3gau_full_io.c"
                  ,0x1a2,"Read %s%s%s%s [%ux%ux%u vector arrays]\n",fn,pcVar4,pcVar13,pcVar14,
                  (ulong)n_cb,(ulong)n_feat,(ulong)n_density);
        }
      }
      return iVar7;
    }
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3gau_full_io.c"
            ,299,"Version mismatch for %s, file ver: %s != reader ver: %s\n",fn,pcVar4,"1.0");
  }
LAB_00104362:
  exit(1);
}

Assistant:

int
s3gaucnt_read_full(const char *fn,
		   vector_t ****out_wt_mean,
		   vector_t *****out_wt_var,
		   int32 *out_pass2var,
		   float32 ****out_dnom,
		   uint32 *out_n_cb,
		   uint32 *out_n_feat,
		   uint32 *out_n_density,
		   uint32 **out_veclen)
{
    uint32 rd_chksum = 0;
    uint32 sv_chksum;
    uint32 ignore;
    char *ver;
    char *do_chk;
    FILE *fp;
    uint32 swap;

    uint32 has_means;
    uint32 has_vars;
    uint32 pass2var;
    uint32 n_cb;
    uint32 n_feat;
    uint32 n_density;
    uint32 *veclen;
    float32 *buf;
    float32 ***dnom;
    uint32 n, i, b_i, j, k, l, d1, d2, d3;
    vector_t ***wt_mean = NULL;
    vector_t ****wt_var = NULL;

    fp = s3open(fn, "rb", &swap);
    if (fp == NULL)
	return S3_ERROR;

    /* check version id */
    ver = s3get_gvn_fattr("version");
    if (ver) {
	if (strcmp(ver, GAUCNT_FILE_VERSION) != 0) {
	    E_FATAL("Version mismatch for %s, file ver: %s != reader ver: %s\n",
		    fn, ver, GAUCNT_FILE_VERSION);
	}
    }
    else {
	E_FATAL("No version attribute for %s\n", fn);
    }
    
    /* if do_chk is non-NULL, there is a checksum after the data in the file */
    do_chk = s3get_gvn_fattr("chksum0");

    if (bio_fread((void *)&has_means, sizeof(uint32), 1, fp, swap, &rd_chksum) != 1) {
	return S3_ERROR;
    }

    if (bio_fread((void *)&has_vars, sizeof(uint32), 1, fp, swap, &rd_chksum) != 1) {
	return S3_ERROR;
    }

    if (bio_fread((void *)&pass2var, sizeof(uint32), 1, fp, swap, &rd_chksum) != 1) {
	return S3_ERROR;
    }

    if (bio_fread((void *)&n_cb, sizeof(uint32), 1, fp, swap, &rd_chksum) != 1) {
	return S3_ERROR;
    }

    if (bio_fread((void *)&n_density, sizeof(uint32), 1, fp, swap, &rd_chksum) != 1) {
	return S3_ERROR;
    }

    if (bio_fread_1d((void **)&veclen, sizeof(uint32), &n_feat, fp, swap, &rd_chksum) < 0) {
	return S3_ERROR;
    }

    if (has_means) {
	if (bio_fread_1d((void *)&buf, sizeof(float32), &n, fp, swap, &rd_chksum) < 0) {
	    return S3_ERROR;
	}
	
	wt_mean = (vector_t ***)ckd_calloc_3d(n_cb, n_feat, n_density, sizeof(vector_t));

	for (i = 0, b_i = 0; i < n_cb; i++) {
	    for (j = 0; j < n_feat; j++) {
		for (k = 0; k < n_density; k++) {
		    wt_mean[i][j][k] = &buf[b_i];

		    b_i += veclen[j];
		}
	    }
	}
    }

    if (has_vars) {
	uint32 blk, maxveclen;

	for (i = 0, blk = 0, maxveclen = 0; i < n_feat; i++) {
	    blk += veclen[i];
	    if (veclen[i] > maxveclen) maxveclen = veclen[i];
	}

	if (bio_fread_1d((void *)&buf, sizeof(float32), &n, fp, swap, &rd_chksum) < 0) {
	    return S3_ERROR;
	}
	assert(n == n_cb * n_density * blk * blk);
	
	wt_var = (vector_t ****)ckd_calloc_4d(n_cb, n_feat, n_density,
					      maxveclen, sizeof(vector_t));

	for (i = 0, b_i = 0; i < n_cb; i++) {
	    for (j = 0; j < n_feat; j++) {
		for (k = 0; k < n_density; k++) {
		    for (l = 0; l < veclen[j]; l++) {
			wt_var[i][j][k][l] = &buf[b_i];

			b_i += veclen[j];
		    }
		}
	    }
	}
    }

    if (bio_fread_3d((void ****)&dnom, sizeof(float32), &d1, &d2, &d3, fp, swap, &rd_chksum) < 0) {
	return S3_ERROR;
    }

    assert(d1 == n_cb);
    assert(d2 == n_feat);
    assert(d3 == n_density);

    if (do_chk) {
	/* See if the checksum in the file matches that which
	   was computed from the read data */
	
	if (bio_fread(&sv_chksum, sizeof(uint32), 1, fp, swap, &ignore) != 1) {
	    s3close(fp);
	    return S3_ERROR;
	}
	
	if (sv_chksum != rd_chksum) {
	    E_FATAL("Checksum error; read corrupt data.\n");
	}
    }
    
    s3close(fp);

    *out_wt_mean = wt_mean;
    *out_wt_var = wt_var;
    *out_pass2var = pass2var;
    *out_dnom = dnom;
    *out_n_cb = n_cb;
    *out_n_feat = n_feat;
    *out_n_density = n_density;
    *out_veclen = veclen;

    E_INFO("Read %s%s%s%s [%ux%ux%u vector arrays]\n",
	   fn,
	   (has_means ? " with means" : ""),
	   (has_vars ? " with vars" : ""),
	   (has_vars && pass2var ? " (2pass)" : ""),
	   n_cb, n_feat, n_density);

    return S3_SUCCESS;
}